

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseJacocoCoverage.cxx
# Opt level: O2

void __thiscall
cmParseJacocoCoverage::XMLParser::XMLParser
          (XMLParser *this,cmCTest *ctest,cmCTestCoverageHandlerContainer *cont)

{
  cmXMLParser::cmXMLParser(&this->super_cmXMLParser);
  (this->super_cmXMLParser)._vptr_cmXMLParser = (_func_int **)&PTR__XMLParser_00639e00;
  (this->FilePath)._M_dataplus._M_p = (pointer)&(this->FilePath).field_2;
  (this->FilePath)._M_string_length = 0;
  (this->FilePath).field_2._M_local_buf[0] = '\0';
  (this->PackagePath)._M_dataplus._M_p = (pointer)&(this->PackagePath).field_2;
  (this->PackagePath)._M_string_length = 0;
  (this->PackagePath).field_2._M_local_buf[0] = '\0';
  (this->PackageName)._M_dataplus._M_p = (pointer)&(this->PackageName).field_2;
  (this->PackageName)._M_string_length = 0;
  (this->PackageName).field_2._M_local_buf[0] = '\0';
  this->CTest = ctest;
  this->Coverage = cont;
  return;
}

Assistant:

XMLParser(cmCTest* ctest, cmCTestCoverageHandlerContainer& cont)
    : CTest(ctest)
    , Coverage(cont)
  {
  }